

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ixy-fwd.c
# Opt level: O0

void forward(ixy_device *rx_dev,uint16_t rx_queue,ixy_device *tx_dev,uint16_t tx_queue)

{
  uint32_t uVar1;
  pkt_buf *bufs [32];
  uint32_t i_1;
  uint32_t num_tx;
  uint32_t i;
  uint32_t num_rx;
  uint32_t in_stack_fffffffffffffecc;
  pkt_buf **in_stack_fffffffffffffed0;
  uint16_t in_stack_fffffffffffffede;
  ixy_device *in_stack_fffffffffffffee0;
  uint local_38;
  uint local_30;
  
  uVar1 = ixy_rx_batch(in_stack_fffffffffffffee0,in_stack_fffffffffffffede,in_stack_fffffffffffffed0
                       ,in_stack_fffffffffffffecc);
  if (uVar1 != 0) {
    for (local_30 = 0; local_30 < uVar1; local_30 = local_30 + 1) {
      *(char *)(*(long *)(&stack0xfffffffffffffec8 + (ulong)local_30 * 8) + 0x41) =
           *(char *)(*(long *)(&stack0xfffffffffffffec8 + (ulong)local_30 * 8) + 0x41) + '\x01';
    }
    for (local_38 = ixy_tx_batch(in_stack_fffffffffffffee0,in_stack_fffffffffffffede,
                                 in_stack_fffffffffffffed0,in_stack_fffffffffffffecc);
        local_38 < uVar1; local_38 = local_38 + 1) {
      pkt_buf_free(*(pkt_buf **)(&stack0xfffffffffffffec8 + (ulong)local_38 * 8));
    }
  }
  return;
}

Assistant:

static void forward(struct ixy_device* rx_dev, uint16_t rx_queue, struct ixy_device* tx_dev, uint16_t tx_queue) {
	struct pkt_buf* bufs[BATCH_SIZE];
	uint32_t num_rx = ixy_rx_batch(rx_dev, rx_queue, bufs, BATCH_SIZE);
	if (num_rx > 0) {
		// touch all packets, otherwise it's a completely unrealistic workload if the packet just stays in L3
		for (uint32_t i = 0; i < num_rx; i++) {
			bufs[i]->data[1]++;
		}
		uint32_t num_tx = ixy_tx_batch(tx_dev, tx_queue, bufs, num_rx);
		// there are two ways to handle the case that packets are not being sent out:
		// either wait on tx or drop them; in this case it's better to drop them, otherwise we accumulate latency
		for (uint32_t i = num_tx; i < num_rx; i++) {
			pkt_buf_free(bufs[i]);
		}
	}
}